

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::loadVectors(FastText *this,string *filename)

{
  int iVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  _Alloc_hider __nptr;
  undefined8 uVar7;
  undefined8 this_01;
  undefined8 uVar8;
  char cVar9;
  int32_t iVar10;
  uint uVar11;
  istream *piVar12;
  ostream *poVar13;
  int *piVar14;
  undefined8 uVar15;
  invalid_argument *piVar16;
  long *plVar17;
  size_type *psVar18;
  Matrix *pMVar19;
  long lVar20;
  EVP_PKEY_CTX *ctx;
  long lVar21;
  long lVar22;
  ulong uVar23;
  double dVar24;
  int64_t n;
  int64_t dim;
  string entry;
  string line;
  string word;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  stringstream ss;
  ifstream in;
  ulong local_4c8;
  long local_4c0;
  ulong local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  char *local_490;
  long local_488;
  char local_480 [16];
  value_type local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_428;
  string local_408;
  string local_3e8;
  undefined1 local_3c8 [128];
  ios_base local_348 [272];
  long local_238 [65];
  
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  local_428.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_428.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cVar9 = std::__basic_file<char>::is_open();
  if (cVar9 == '\0') {
    piVar16 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
                   filename," cannot be opened for loading!");
    std::invalid_argument::invalid_argument(piVar16,(string *)local_3c8);
    __cxa_throw(piVar16,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar12 = std::istream::_M_extract<long>(local_238);
  std::istream::_M_extract<long>((long *)piVar12);
  local_490 = local_480;
  local_488 = 0;
  local_480[0] = '\0';
  cVar9 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_490,cVar9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Trying to load precomputed stuff ",0x21);
  poVar13 = std::ostream::_M_insert<long>((long)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
  poVar13 = std::ostream::_M_insert<long>((long)poVar13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  if (local_4c0 !=
      ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->dim) {
    piVar16 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_408,local_4c0);
    std::operator+(&local_448,"Dimension of pretrained vectors (",&local_408);
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_448);
    psVar18 = (size_type *)(plVar17 + 2);
    local_4b0._M_dataplus._M_p = (pointer)*plVar17;
    if ((size_type *)local_4b0._M_dataplus._M_p == psVar18) {
      local_4b0.field_2._M_allocated_capacity = *psVar18;
      local_4b0.field_2._8_8_ = plVar17[3];
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
    }
    else {
      local_4b0.field_2._M_allocated_capacity = *psVar18;
    }
    local_4b0._M_string_length = plVar17[1];
    *plVar17 = (long)psVar18;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::__cxx11::to_string
              (&local_3e8,
               ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->dim);
    std::operator+(&local_470,&local_4b0,&local_3e8);
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_470);
    pMVar19 = (Matrix *)(plVar17 + 2);
    local_3c8._0_8_ = *plVar17;
    if ((Matrix *)local_3c8._0_8_ == pMVar19) {
      local_3c8._16_8_ =
           (pMVar19->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_3c8._24_8_ = plVar17[3];
      local_3c8._0_8_ = (Matrix *)(local_3c8 + 0x10);
    }
    else {
      local_3c8._16_8_ =
           (pMVar19->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    local_3c8._8_8_ = plVar17[1];
    *plVar17 = (long)pMVar19;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::invalid_argument::invalid_argument(piVar16,(string *)local_3c8);
    __cxa_throw(piVar16,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_3c8._0_8_ = (Matrix *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>,long&,long&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3c8 + 8),(Matrix **)local_3c8,
             (allocator<fasttext::Matrix> *)&local_470,(long *)&local_4c8,&local_4c0);
  this_01 = local_3c8._8_8_;
  uVar15 = local_3c8._0_8_;
  if (local_4c8 != 0) {
    lVar20 = 0;
    local_4b8 = 0;
    do {
      cVar9 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_490,cVar9);
      if (local_488 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"could not load ",0xf);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,local_490,local_488);
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
      }
      else {
        local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
        local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
        local_470._M_string_length = 0;
        local_4b0._M_string_length = 0;
        local_470.field_2._M_local_buf[0] = '\0';
        local_4b0.field_2._M_allocated_capacity =
             local_4b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)local_3c8,(string *)&local_490,_S_out|_S_in);
        if (-1 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->dim) {
          lVar22 = -1;
          do {
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c8,(string *)&local_4b0,' ');
            if (lVar22 == -1) {
              std::__cxx11::string::_M_assign((string *)&local_470);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_428,&local_470);
              Dictionary::add((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,&local_470);
            }
            else {
              std::__cxx11::string::string
                        ((string *)&local_448,local_4b0._M_dataplus._M_p,(allocator *)&local_3e8);
              __nptr._M_p = local_448._M_dataplus._M_p;
              piVar14 = __errno_location();
              iVar1 = *piVar14;
              *piVar14 = 0;
              dVar24 = strtod(__nptr._M_p,(char **)&local_408);
              if (local_408._M_dataplus._M_p == __nptr._M_p) {
                uVar15 = std::__throw_invalid_argument("stod");
LAB_00121315:
                std::__cxx11::stringstream::~stringstream((stringstream *)local_3c8);
                std::ios_base::~ios_base(local_348);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
                  operator_delete(local_4b0._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_470._M_dataplus._M_p != &local_470.field_2) {
                  operator_delete(local_470._M_dataplus._M_p);
                }
                if (local_490 != local_480) {
                  operator_delete(local_490);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_428);
                std::ifstream::~ifstream(local_238);
                _Unwind_Resume(uVar15);
              }
              if (*piVar14 == 0) {
                *piVar14 = iVar1;
              }
              else if (*piVar14 == 0x22) {
                uVar15 = std::__throw_out_of_range("stod");
                goto LAB_00121315;
              }
              *(float *)(*(int64_t *)(uVar15 + 0x20) * lVar20 + *(long *)uVar15 + lVar22 * 4) =
                   (float)dVar24;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_448._M_dataplus._M_p != &local_448.field_2) {
                operator_delete(local_448._M_dataplus._M_p);
              }
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < ((this->args_).
                             super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                            ->dim);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_3c8);
        std::ios_base::~ios_base(local_348);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470._M_dataplus._M_p != &local_470.field_2) {
          operator_delete(local_470._M_dataplus._M_p);
        }
      }
      lVar20 = lVar20 + 4;
      local_4b8 = local_4b8 + 1;
    } while (local_4b8 < local_4c8);
  }
  std::ifstream::close();
  ctx = (EVP_PKEY_CTX *)0x1;
  Dictionary::threshold
            ((this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,1,0);
  Dictionary::init((this->dict_).
                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,ctx);
  iVar10 = Dictionary::nwords((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_3c8._0_8_ = (element_type *)0x0;
  local_470._M_dataplus._M_p._0_4_ = iVar10 + peVar2->bucket;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>,int,int&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3c8 + 8),(Matrix **)local_3c8,
             (allocator<fasttext::Matrix> *)&local_4b0,(int *)&local_470,&peVar2->dim);
  uVar8 = local_3c8._8_8_;
  uVar7 = local_3c8._0_8_;
  local_3c8._0_8_ = (Matrix *)0x0;
  local_3c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar7;
  (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
  if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._8_8_ !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._8_8_);
  }
  Matrix::uniform((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,1.0 / (float)((this->args_).
                                       super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->dim);
  if (local_4c8 != 0) {
    lVar20 = 0;
    uVar23 = 0;
    do {
      uVar11 = Dictionary::getId((this->dict_).
                                 super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,local_428.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar23);
      if (((-1 < (int)uVar11) &&
          (iVar10 = Dictionary::nwords((this->dict_).
                                       super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr), (int)uVar11 < iVar10)) && (local_4c0 != 0)) {
        lVar21 = 0;
        peVar3 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        lVar22 = peVar3->n_;
        lVar4 = (long)(peVar3->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
        lVar5 = *(int64_t *)(uVar15 + 0x20);
        lVar6 = *(long *)uVar15;
        do {
          *(undefined4 *)((ulong)uVar11 * lVar22 * 4 + lVar4 + lVar21 * 4) =
               *(undefined4 *)(lVar5 * lVar20 + lVar6 + lVar21 * 4);
          lVar21 = lVar21 + 1;
        } while (local_4c0 != lVar21);
      }
      uVar23 = uVar23 + 1;
      lVar20 = lVar20 + 4;
    } while (uVar23 < local_4c8);
  }
  if (local_490 != local_480) {
    operator_delete(local_490);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_428);
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void FastText::loadVectors(const std::string& filename) {
	std::ifstream in(filename);
	std::vector<std::string> words;
	std::shared_ptr<Matrix> mat; // temp. matrix for pretrained vectors
	int64_t n, dim;
	if (!in.is_open()) {
		throw std::invalid_argument(filename + " cannot be opened for loading!");
	}
	
	in >> n >> dim;
	std::string line;
	std::getline(in, line);
	std::cerr << "Trying to load precomputed stuff " << n << " " << dim << std::endl;
	if (dim != args_->dim) {
		throw std::invalid_argument(
				"Dimension of pretrained vectors (" + std::to_string(dim) +
				") does not match dimension (" + std::to_string(args_->dim) + ")!");
	}
	mat = std::make_shared<Matrix>(n, dim);
	for (size_t i = 0; i < n; i++) {
		std::getline(in, line);
		if(line.size()>0)
		{
			std::string word;
			std::string entry;
			std::stringstream ss(line);
			for(int j=0;j < args_->dim + 1; j++)
			{
				std::getline(ss, entry, ' ');
				if(j==0)
				{
					word = entry;
					words.push_back(word);
					dict_->add(word);
				}
				else
				{
					try
					{
						mat->at(i, j-1) = std::stod(entry.c_str());
					}
					catch(const std::exception& e)
					{
						std::cerr << "could not load "<< word << " " <<  entry << " " << i << std::endl;
					}
				}
			}
		}
		else
		{
			std::cerr << "could not load "<< line << i << std::endl;
		}
	}
	in.close();
	// std::cerr << dict_->nwords() << std::endl;
	dict_->threshold(1, 0);
	dict_->init();
	input_ =
			std::make_shared<Matrix>(dict_->nwords() + args_->bucket, args_->dim);
	input_->uniform(1.0 / args_->dim);

	for (size_t i = 0; i < n; i++) {
		int32_t idx = dict_->getId(words[i]);
		if (idx < 0 || idx >= dict_->nwords()) {
			continue;
		}
		for (size_t j = 0; j < dim; j++) {
			input_->at(idx, j) = mat->at(i, j);
		}
	}
}